

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

bool internalJSONNode::AreEqualNoCase(char *ch_one,char *ch_two)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  char c_one;
  
  lVar3 = 0;
  do {
    bVar1 = ch_one[lVar3];
    bVar2 = ch_two[lVar3];
    if (bVar1 == 0) {
      return bVar2 == 0;
    }
    if (bVar1 != bVar2) {
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        if (bVar1 != (bVar2 | 0x20)) {
          return false;
        }
      }
      else {
        if (0x19 < (byte)(bVar2 + 0x9f)) {
          return false;
        }
        if (bVar1 != (byte)(bVar2 - 0x20)) {
          return false;
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool internalJSONNode::AreEqualNoCase(const json_char * ch_one, const json_char * ch_two) json_nothrow {
	   while (*ch_one){  //only need to check one, if the other one terminates early, the check will cause it to fail
		  const json_char c_one = *ch_one;
		  const json_char c_two = *ch_two;
		  if (c_one != c_two){
			 if ((c_two > 64) && (c_two < 91)){  //A - Z
				if (c_one != (json_char)(c_two + 32)) return false;
			 } else if ((c_two > 96) && (c_two < 123)){  //a - z
				if (c_one != (json_char)(c_two - 32)) return false;
			 } else { //not a letter, so return false
				return false;
			 }
		  }
		  ++ch_one;
		  ++ch_two;

	   }
	   return *ch_two == '\0';  //this one has to be null terminated too, or else json_string two is longer, hence, not equal
    }